

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_rand.cc
# Opt level: O2

cpp_gen * new_gamma_gen(double alpha,double beta)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  gamma_distribution<double> *this_00;
  cpp_gen *pcVar2;
  random_device rd;
  
  std::random_device::random_device(&rd);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this,(ulong)uVar1);
  this_00 = (gamma_distribution<double> *)operator_new(0x40);
  std::gamma_distribution<double>::gamma_distribution(this_00,alpha,beta);
  pcVar2 = (cpp_gen *)operator_new(0x10);
  pcVar2->d = this_00;
  pcVar2->gen = this;
  std::random_device::~random_device(&rd);
  return pcVar2;
}

Assistant:

struct cpp_gen *new_gamma_gen(double alpha, double beta) {
		std::random_device rd {};
		std::mt19937 *gen = new std::mt19937(rd());
		//std::default_random_engine *gen = new std::default_random_engine;

		std::gamma_distribution<double> *d = new std::gamma_distribution<double>(alpha, beta);
		struct cpp_gen *gg = new struct cpp_gen;
		gg->d = d;
		gg->gen = gen;
		return gg;

	}